

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::SpecparamDeclaratorSyntax::setChild
          (SpecparamDeclaratorSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004fe11c + *(int *)(&DAT_004fe11c + index * 4)))();
  return;
}

Assistant:

void SpecparamDeclaratorSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: equals = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: value1 = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: comma = child.token(); return;
        case 5: value2 = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}